

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynEnumDefinition * ParseEnumDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynConstant> values_00;
  bool bVar1;
  SynIdentifier *this;
  Lexeme *pLVar2;
  Lexeme *end;
  SynConstant *this_00;
  Lexeme *pLVar3;
  InplaceStr IVar4;
  SynBase *local_a0;
  SynBase *value;
  SynIdentifier *nameIdentifier_1;
  InplaceStr name_1;
  Lexeme *pos;
  IntrusiveList<SynConstant> values;
  InplaceStr name;
  SynIdentifier *nameIdentifier;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_enum);
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_11716f::CheckAt(ctx,lex_string,"ERROR: enum name expected");
    if (bVar1) {
      IVar4 = ParseContext::Consume(ctx);
      name.end = (char *)ParseContext::get<SynIdentifier>(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier((SynIdentifier *)name.end,pLVar3,pLVar2,IVar4);
    }
    else {
      name.end = (char *)ParseContext::get<SynIdentifier>(ctx);
      InplaceStr::InplaceStr((InplaceStr *)&values.tail);
      SynIdentifier::SynIdentifier((SynIdentifier *)name.end,stack0xffffffffffffffa8);
    }
    anon_unknown.dwarf_11716f::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after enum name");
    IntrusiveList<SynConstant>::IntrusiveList((IntrusiveList<SynConstant> *)&pos);
    do {
      bVar1 = IntrusiveList<SynConstant>::empty((IntrusiveList<SynConstant> *)&pos);
      if (bVar1) {
        bVar1 = anon_unknown.dwarf_11716f::CheckAt
                          (ctx,lex_string,"ERROR: enumeration name expected after \'{\'");
      }
      else {
        bVar1 = anon_unknown.dwarf_11716f::CheckAt
                          (ctx,lex_string,"ERROR: enumeration name expected after \',\'");
      }
      if (!bVar1) break;
      pLVar3 = ctx->currentLexeme;
      IVar4 = ParseContext::Consume(ctx);
      this = ParseContext::get<SynIdentifier>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      end = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(this,pLVar2,end,IVar4);
      local_a0 = (SynBase *)0x0;
      bVar1 = ParseContext::Consume(ctx,lex_set);
      if ((bVar1) && (local_a0 = ParseTernaryExpr(ctx), local_a0 == (SynBase *)0x0)) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report(ctx,pLVar2,"ERROR: expression not found after \'=\'");
        local_a0 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar2 = ParseContext::Previous(ctx);
        SynError::SynError((SynError *)local_a0,begin,pLVar2);
      }
      this_00 = ParseContext::get<SynConstant>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynConstant::SynConstant(this_00,pLVar3,pLVar2,this,local_a0);
      IntrusiveList<SynConstant>::push_back((IntrusiveList<SynConstant> *)&pos,this_00);
      bVar1 = ParseContext::Consume(ctx,lex_comma);
    } while (bVar1);
    anon_unknown.dwarf_11716f::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after enum definition");
    ctx_local = (ParseContext *)ParseContext::get<SynEnumDefinition>(ctx);
    pLVar3 = ParseContext::Previous(ctx);
    values_00.tail = values.head;
    values_00.head = (SynConstant *)pos;
    SynEnumDefinition::SynEnumDefinition
              ((SynEnumDefinition *)ctx_local,begin,pLVar3,(SynIdentifier *)name.end,values_00);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynEnumDefinition *)ctx_local;
}

Assistant:

SynEnumDefinition* ParseEnumDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_enum))
	{
		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: enum name expected"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after enum name");

		IntrusiveList<SynConstant> values;

		do
		{
			if(values.empty())
			{
				if(!CheckAt(ctx, lex_string, "ERROR: enumeration name expected after '{'"))
					break;
			}
			else
			{
				if(!CheckAt(ctx, lex_string, "ERROR: enumeration name expected after ','"))
					break;
			}

			Lexeme *pos = ctx.currentLexeme;

			InplaceStr name = ctx.Consume();
			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

			SynBase *value = NULL;

			if(ctx.Consume(lex_set))
			{
				value = ParseTernaryExpr(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

					value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
				}
			}

			values.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));
		}
		while(ctx.Consume(lex_comma));

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after enum definition");

		return new (ctx.get<SynEnumDefinition>()) SynEnumDefinition(start, ctx.Previous(), nameIdentifier, values);
	}

	return NULL;
}